

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlgorithmSinglePixelSwapRgb.cpp
# Opt level: O2

void __thiscall AlgorithmSinglePixelSwapRgb::Iterate(AlgorithmSinglePixelSwapRgb *this)

{
  qulonglong *pqVar1;
  QImage *pQVar2;
  int iVar3;
  QRgb QVar4;
  QRgb a;
  QRgb QVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  qulonglong _t1;
  QPoint aLoc;
  QPoint bLoc;
  QPoint local_5c;
  QRgb local_54;
  int local_50;
  int local_4c;
  QPoint local_48;
  QImage *local_40;
  QImage *local_38;
  
  local_40 = &(this->super_AlgorithmBase).allRgb_;
  local_38 = &(this->super_AlgorithmBase).target_;
  iVar3 = 100000;
  while (iVar3 != 0) {
    local_4c = iVar3 + -1;
    iVar3 = AlgorithmBase::RandomNumber(&this->super_AlgorithmBase,0,0xfff);
    local_5c.yp = AlgorithmBase::RandomNumber(&this->super_AlgorithmBase,0,0xfff);
    local_5c.xp = iVar3;
    iVar3 = AlgorithmBase::RandomNumber(&this->super_AlgorithmBase,0,0xfff);
    local_48.yp = AlgorithmBase::RandomNumber(&this->super_AlgorithmBase,0,0xfff);
    pQVar2 = local_40;
    local_48.xp = iVar3;
    QVar4 = QImage::pixel(local_40,&local_5c);
    a = QImage::pixel(pQVar2,&local_48);
    pQVar2 = local_38;
    QVar5 = QImage::pixel(local_38,&local_5c);
    local_50 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,QVar4,QVar5);
    QVar5 = QImage::pixel(pQVar2,&local_48);
    iVar6 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,a,QVar5);
    QVar5 = QImage::pixel(pQVar2,&local_48);
    local_54 = QVar4;
    iVar7 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,QVar4,QVar5);
    QVar4 = QImage::pixel(pQVar2,&local_5c);
    iVar8 = AlgorithmBase::ColourDifference(&this->super_AlgorithmBase,a,QVar4);
    pQVar2 = local_40;
    iVar3 = local_4c;
    if (iVar8 + iVar7 < iVar6 + local_50) {
      QImage::setPixel(local_40,&local_5c,a);
      QImage::setPixel(pQVar2,&local_48,local_54);
      pqVar1 = &(this->super_AlgorithmBase).improvements_;
      *pqVar1 = *pqVar1 + 1;
      iVar3 = local_4c;
    }
  }
  _t1 = (this->super_AlgorithmBase).iterations_ + 100000;
  (this->super_AlgorithmBase).iterations_ = _t1;
  AlgorithmBase::onIterationsChanged(&this->super_AlgorithmBase,_t1);
  AlgorithmBase::onImprovementsChanged
            (&this->super_AlgorithmBase,(this->super_AlgorithmBase).improvements_);
  return;
}

Assistant:

void AlgorithmSinglePixelSwapRgb::Iterate()
{
    // Do a block of repeats in one go for efficiency
    const int repeats = 100000;
    for (int i = 0; i < repeats; ++i) {
        QPoint aLoc{ RandomNumber(0, 4096 - 1), RandomNumber(0, 4096 - 1) };
        QPoint bLoc{ RandomNumber(0, 4096 - 1), RandomNumber(0, 4096 - 1) };
        QRgb a = allRgb_.pixel(aLoc);
        QRgb b = allRgb_.pixel(bLoc);

        int aDifference = ColourDifference(a, target_.pixel(aLoc));
        int bDifference = ColourDifference(b, target_.pixel(bLoc));

        int aSwappedDifference = ColourDifference(a, target_.pixel(bLoc));
        int bSwappedDifference = ColourDifference(b, target_.pixel(aLoc));

        if ((aDifference + bDifference) > (aSwappedDifference + bSwappedDifference)) {
            allRgb_.setPixel(aLoc, b);
            allRgb_.setPixel(bLoc, a);
            ++improvements_;
        }
    }
    iterations_ += repeats;

    emit onIterationsChanged(iterations_);
    emit onImprovementsChanged(improvements_);
}